

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

Vec_Int_t * Gia_ManCollectDoms(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  size_t __nmemb;
  uint Entry;
  ulong uVar8;
  bool bVar9;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  iVar1 = p->nObjs;
  if (0 < iVar1) {
    uVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((p->pObjs[uVar7].field_0x7 & 0x40) != 0) &&
         ((p->pRefs == (int *)0x0 || (p->pRefs[uVar7] != 0)))) {
        if ((long)p->vDoms->nSize <= (long)uVar7) {
LAB_0057d58b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (ulong)(uint)p->vDoms->pArray[uVar7];
        if (uVar7 != uVar8 && uVar8 != 0xffffffff) {
          uVar5 = 0;
          do {
            Entry = (uint)uVar8;
            if (((int)Entry < 0) || (iVar1 <= (int)Entry)) {
LAB_0057d56c:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar3 = (uint)*(undefined8 *)(p->pObjs + uVar8);
            if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) break;
            Vec_IntPush(p_00,Entry);
            iVar1 = p->nObjs;
            if (iVar1 <= (int)Entry) goto LAB_0057d56c;
            if (p->vDoms->nSize <= (int)Entry) goto LAB_0057d58b;
            uVar3 = p->vDoms->pArray[uVar8];
            if (uVar3 == Entry) break;
            uVar8 = (ulong)uVar3;
            bVar9 = uVar5 < 999999999;
            uVar5 = uVar5 + 1;
          } while (bVar9);
        }
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)iVar1);
    __nmemb = (size_t)p_00->nSize;
    if (1 < (long)__nmemb) {
      piVar2 = p_00->pArray;
      qsort(piVar2,__nmemb,4,Vec_IntSortCompare1);
      iVar1 = 1;
      sVar4 = 1;
      do {
        if (piVar2[sVar4] != piVar2[sVar4 - 1]) {
          lVar6 = (long)iVar1;
          iVar1 = iVar1 + 1;
          piVar2[lVar6] = piVar2[sVar4];
        }
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
      p_00->nSize = iVar1;
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int Lev, LevMax = ABC_INFINITY;
    int i, iDom, iDomNext;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMark1 )
            continue;
        if ( p->pRefs && Gia_ObjRefNum(p, pObj) == 0 )
            continue;
        iDom = Gia_ObjDom(p, pObj);
        if ( iDom == -1 )
            continue;
        if ( iDom == i )
            continue;
        for ( Lev = 0; Lev < LevMax && Gia_ObjIsAnd( Gia_ManObj(p, iDom) ); Lev++ )
        {
            Vec_IntPush( vNodes, iDom );
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom) );
            if ( iDomNext == iDom )
                break;
            iDom = iDomNext;
        }
    }
    Vec_IntUniqify( vNodes );
    return vNodes;
}